

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O1

void nestl::test::detail::
     print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,char_const*,char_const*,nestl::has_exceptions::exception_ptr_error>,0ul,1ul,2ul,3ul>
               (ostream *os,exception_ptr_error *t)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  
  pcVar1 = (char *)t[3].m_exception._M_exception_object;
  iVar2 = (int)os;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  pcVar1 = (char *)t[2].m_exception._M_exception_object;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  pcVar1 = (char *)t[1].m_exception._M_exception_object;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar3);
  }
  has_exceptions::operator<<(os,t);
  return;
}

Assistant:

void print_tuple_impl(std::basic_ostream<Ch, Tr>& os, const Tuple& t, seq<Is...>)
{
    using swallow = int[1 + sizeof...(Is)];
    (void)swallow
    {
        0,
        (void(os << /* (Is == 0 ? "" : ", ") << */ std::get<Is>(t)), 0)...
    };
}